

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

word Shr_ManComputeTruth6(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Wrd_t *vTruths)

{
  int iVar1;
  word wVar2;
  long lVar3;
  word *pwVar4;
  
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    Gia_ManIncrementTravId(p);
    pwVar4 = Truth;
    for (lVar3 = 0; lVar3 < vLeaves->nSize; lVar3 = lVar3 + 1) {
      iVar1 = Vec_IntEntry(vLeaves,(int)lVar3);
      Gia_ObjSetTravIdCurrentId(p,iVar1);
      Vec_WrdWriteEntry(vTruths,iVar1,*pwVar4);
      pwVar4 = pwVar4 + 1;
    }
    iVar1 = Gia_ObjId(p,pObj);
    wVar2 = Shr_ManComputeTruth6_rec(p,iVar1,vTruths);
    return wVar2;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                ,0x152,
                "word Shr_ManComputeTruth6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)");
}

Assistant:

word Shr_ManComputeTruth6( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Wrd_t * vTruths )
{
    int i, iLeaf;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vLeaves, iLeaf, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iLeaf );
        Vec_WrdWriteEntry( vTruths, iLeaf, Truth[i] );
    }
    return Shr_ManComputeTruth6_rec( p, Gia_ObjId(p, pObj), vTruths );
}